

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_context_test_rate_and_add_native_data_format__alsa
               (ma_context *pContext,ma_snd_pcm_t *pPCM,ma_snd_pcm_hw_params_t *pHWParams,
               ma_format format,ma_uint32 channels,ma_uint32 sampleRate,ma_uint32 flags,
               ma_device_info *pDeviceInfo)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  undefined4 in_stack_0000000c;
  
  if (pPCM == (ma_snd_pcm_t *)0x0) {
    __assert_fail("pPCM != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                  ,0x6aee,
                  "void ma_context_test_rate_and_add_native_data_format__alsa(ma_context *, ma_snd_pcm_t *, ma_snd_pcm_hw_params_t *, ma_format, ma_uint32, ma_uint32, ma_uint32, ma_device_info *)"
                 );
  }
  lVar2 = CONCAT44(in_stack_0000000c,flags);
  if (lVar2 != 0) {
    if (*(uint *)(lVar2 + 0x204) < 0x40) {
      iVar3 = (*(pContext->field_14).alsa.snd_pcm_hw_params_test_rate)
                        (pPCM,pHWParams,(ulong)sampleRate,0);
      if (iVar3 == 0) {
        uVar1 = *(uint *)(lVar2 + 0x204);
        lVar4 = (ulong)uVar1 * 0x10;
        *(ma_format *)(lVar2 + 0x208 + lVar4) = format;
        *(ma_uint32 *)(lVar2 + 0x20c + lVar4) = channels;
        *(ma_uint32 *)(lVar2 + 0x210 + lVar4) = sampleRate;
        *(undefined4 *)(lVar2 + 0x214 + lVar4) = 0;
        *(uint *)(lVar2 + 0x204) = uVar1 + 1;
      }
    }
    return;
  }
  __assert_fail("pDeviceInfo != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                ,0x6af0,
                "void ma_context_test_rate_and_add_native_data_format__alsa(ma_context *, ma_snd_pcm_t *, ma_snd_pcm_hw_params_t *, ma_format, ma_uint32, ma_uint32, ma_uint32, ma_device_info *)"
               );
}

Assistant:

static void ma_context_test_rate_and_add_native_data_format__alsa(ma_context* pContext, ma_snd_pcm_t* pPCM, ma_snd_pcm_hw_params_t* pHWParams, ma_format format, ma_uint32 channels, ma_uint32 sampleRate, ma_uint32 flags, ma_device_info* pDeviceInfo)
{
    MA_ASSERT(pPCM        != NULL);
    MA_ASSERT(pHWParams   != NULL);
    MA_ASSERT(pDeviceInfo != NULL);

    if (pDeviceInfo->nativeDataFormatCount < ma_countof(pDeviceInfo->nativeDataFormats) && ((ma_snd_pcm_hw_params_test_rate_proc)pContext->alsa.snd_pcm_hw_params_test_rate)(pPCM, pHWParams, sampleRate, 0) == 0) {
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].format     = format;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].channels   = channels;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].sampleRate = sampleRate;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].flags      = flags;
        pDeviceInfo->nativeDataFormatCount += 1;
    }
}